

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

uint32_t __thiscall jpgd::jpeg_decoder::H2V2ConvertFiltered(jpeg_decoder *this)

{
  long lVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  uint8 *puVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint8 uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  uint8 *puVar30;
  uint uVar31;
  uint8 *puVar32;
  uint uVar33;
  uint8 *local_b8;
  uint local_b0;
  uint local_a8;
  uint8 *local_a0;
  uint32_t local_94;
  
  uVar19 = this->m_image_y_size - this->m_total_lines_left;
  uVar16 = uVar19 & 0xf;
  uVar26 = (this->m_image_y_size >> 1) - 1;
  local_a0 = this->m_pScan_line_0;
  iVar25 = (int)(uVar19 - 1) >> 1;
  if ((int)(iVar25 + 1U) < (int)uVar26) {
    uVar26 = iVar25 + 1U;
  }
  puVar11 = this->m_pSample_buf;
  puVar30 = puVar11;
  puVar32 = puVar11;
  if ((-1 < iVar25) && (((uVar16 == 0xf || (uVar16 == 0)) && (1 < this->m_total_lines_left)))) {
    if ((int)uVar19 < 1) {
      __assert_fail("y > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x771,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if (this->m_sample_buf_prev_valid == false) {
      __assert_fail("m_sample_buf_prev_valid",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x772,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    puVar30 = this->m_pSample_buf_prev;
    if (uVar16 == 0xf) {
      puVar32 = puVar30;
    }
  }
  uVar2 = (uVar19 & 8) * 0x10 + (uVar19 & 7) * 8;
  uVar27 = iVar25 * 8 & 0x38U | 0x100;
  uVar31 = (uVar26 & 7) << 3 | 0x100;
  iVar28 = this->m_image_x_size;
  uVar26 = (iVar28 >> 1) - 1;
  if ((uVar16 == 0) || (uVar16 == 0xf)) {
    local_94 = 1;
    lVar1 = (ulong)(uVar19 & 1) * 8;
    uVar16 = 0;
    for (uVar18 = 0; uVar13 = (uint)uVar18, (int)uVar13 < iVar28; uVar18 = uVar18 + 1) {
      iVar25 = check_sample_buf_ofs
                         (this,(uVar13 & 7 | uVar16 & 0x40 | uVar2) +
                               ((uint)(uVar18 >> 4) & 0xfffffff) * 0x180);
      uVar12 = (uint)puVar32[iVar25];
      uVar20 = (int)(uVar13 - 1) >> 1;
      uVar33 = uVar20 + 1;
      if ((int)uVar26 <= (int)(uVar20 + 1)) {
        uVar33 = uVar26;
      }
      if ((int)uVar20 < 1) {
        uVar20 = 0;
      }
      uVar20 = uVar20 & 7 | (uVar20 >> 3) * 0x180;
      iVar25 = check_sample_buf_ofs(this,uVar20 + uVar27);
      bVar3 = puVar30[iVar25];
      iVar25 = check_sample_buf_ofs(this,uVar27 + uVar20 + 0x40);
      bVar4 = puVar30[iVar25];
      puVar11 = this->m_pSample_buf;
      iVar25 = check_sample_buf_ofs(this,uVar20 + uVar31);
      bVar5 = puVar11[iVar25];
      puVar11 = this->m_pSample_buf;
      iVar25 = check_sample_buf_ofs(this,uVar31 + uVar20 + 0x40);
      bVar6 = puVar11[iVar25];
      uVar33 = uVar33 & 7 | (uVar33 >> 3) * 0x180;
      iVar25 = check_sample_buf_ofs(this,uVar33 + uVar27);
      bVar7 = puVar30[iVar25];
      iVar25 = check_sample_buf_ofs(this,uVar27 + uVar33 + 0x40);
      bVar8 = puVar30[iVar25];
      puVar11 = this->m_pSample_buf;
      iVar25 = check_sample_buf_ofs(this,uVar33 + uVar31);
      bVar9 = puVar11[iVar25];
      puVar11 = this->m_pSample_buf;
      iVar25 = check_sample_buf_ofs(this,uVar33 + uVar31 | 0x40);
      uVar14 = (ulong)(uVar13 & 1);
      uVar13 = (uint)H2V2ConvertFiltered::s_muls[uVar19 & 1][uVar14][0];
      uVar20 = (uint)*(byte *)(lVar1 + 0x18a841 + uVar14 * 4);
      uVar21 = (uint)*(byte *)(lVar1 + 0x18a842 + uVar14 * 4);
      uVar17 = (uint)*(byte *)(lVar1 + 0x18a843 + uVar14 * 4);
      uVar33 = puVar11[iVar25] * uVar17 + bVar8 * uVar21 + bVar6 * uVar20 + bVar4 * uVar13 + 8 >> 4;
      uVar13 = bVar7 * uVar21 + bVar5 * uVar20 + bVar3 * uVar13 + bVar9 * uVar17 + 8 >> 4;
      iVar25 = this->m_crr[uVar33] + uVar12;
      if (iVar25 < 1) {
        iVar25 = 0;
      }
      uVar15 = (uint8)iVar25;
      if (0xfe < iVar25) {
        uVar15 = 0xff;
      }
      iVar25 = (this->m_cbg[uVar13] + this->m_crg[uVar33] >> 0x10) + uVar12;
      iVar28 = uVar12 + this->m_cbb[uVar13];
      if (iVar25 < 1) {
        iVar25 = 0;
      }
      local_a0[uVar18 * 4] = uVar15;
      uVar15 = (uint8)iVar25;
      if (0xfe < iVar25) {
        uVar15 = 0xff;
      }
      local_a0[uVar18 * 4 + 1] = uVar15;
      if (iVar28 < 1) {
        iVar28 = 0;
      }
      uVar15 = (uint8)iVar28;
      if (0xfe < iVar28) {
        uVar15 = 0xff;
      }
      local_a0[uVar18 * 4 + 2] = uVar15;
      local_a0[uVar18 * 4 + 3] = 0xff;
      iVar28 = this->m_image_x_size;
      uVar16 = uVar16 + 8;
    }
  }
  else {
    if ((uVar19 & 1) == 0) {
      __assert_fail("(row & 1) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x788,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if ((int)uVar19 >> 1 != iVar25) {
      __assert_fail("((y + 1 - 1) >> 1) == c_y0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x789,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if (puVar32 != puVar11) {
      __assert_fail("p_YSamples == m_pSample_buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x78b,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if (puVar30 != puVar11) {
      __assert_fail("p_C0Samples == m_pSample_buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x78c,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    local_b8 = this->m_pScan_line_1;
    iVar25 = (uVar16 + 1 & 8) * 0x10 + (uVar16 + 1 & 6) * 8;
    local_94 = 2;
    uVar18 = 0;
    while (uVar16 = (uint)uVar18, (int)uVar16 < iVar28) {
      uVar19 = uVar16 & 7 | (int)(uVar18 >> 4) * 0x180 + (uVar16 & 8) * 8;
      iVar28 = check_sample_buf_ofs(this,uVar19 + uVar2);
      uVar33 = (uint)puVar32[iVar28];
      iVar28 = check_sample_buf_ofs(this,uVar19 + iVar25);
      uVar13 = (int)(uVar16 - 1) >> 1;
      uVar19 = uVar13 + 1;
      if ((int)uVar26 <= (int)(uVar13 + 1)) {
        uVar19 = uVar26;
      }
      if ((int)uVar13 < 1) {
        uVar13 = 0;
      }
      uVar20 = (uint)puVar32[iVar28];
      uVar21 = uVar13 & 7 | (uVar13 >> 3) * 0x180;
      iVar28 = check_sample_buf_ofs(this,uVar21 + uVar27);
      bVar3 = puVar30[iVar28];
      iVar28 = check_sample_buf_ofs(this,uVar27 + uVar21 + 0x40);
      bVar4 = puVar30[iVar28];
      puVar11 = this->m_pSample_buf;
      iVar28 = check_sample_buf_ofs(this,uVar21 + uVar31);
      uVar12 = (uint)puVar11[iVar28];
      puVar11 = this->m_pSample_buf;
      iVar28 = check_sample_buf_ofs(this,uVar21 + uVar31 + 0x40);
      uVar21 = (uint)puVar11[iVar28];
      uVar19 = uVar19 & 7 | (uVar19 >> 3) * 0x180;
      iVar28 = check_sample_buf_ofs(this,uVar19 + uVar27);
      bVar5 = puVar30[iVar28];
      iVar28 = check_sample_buf_ofs(this,uVar27 + uVar19 + 0x40);
      bVar6 = puVar30[iVar28];
      puVar11 = this->m_pSample_buf;
      iVar28 = check_sample_buf_ofs(this,uVar19 + uVar31);
      bVar7 = puVar11[iVar28];
      puVar11 = this->m_pSample_buf;
      iVar28 = check_sample_buf_ofs(this,uVar19 + uVar31 | 0x40);
      bVar8 = puVar11[iVar28];
      uVar19 = uVar16 & 1;
      bVar9 = H2V2ConvertFiltered::s_muls[1][uVar19][0];
      local_b0 = (uint)bVar3;
      uVar17 = (uint)H2V2ConvertFiltered::s_muls[1][uVar19][1];
      bVar10 = H2V2ConvertFiltered::s_muls[1][uVar19][2];
      uVar23 = (uint)H2V2ConvertFiltered::s_muls[1][uVar19][3];
      uVar22 = uVar23 * bVar8 +
               (uint)bVar10 * (uint)bVar6 + uVar17 * uVar21 + (uint)bVar9 * (uint)bVar4 + 8 >> 4;
      uVar17 = (uint)bVar10 * (uint)bVar5 + uVar17 * uVar12 + bVar9 * local_b0 + uVar23 * bVar7 + 8
               >> 4;
      iVar28 = this->m_crr[uVar22] + uVar33;
      if (iVar28 < 1) {
        iVar28 = 0;
      }
      uVar15 = (uint8)iVar28;
      if (0xfe < iVar28) {
        uVar15 = 0xff;
      }
      iVar28 = (this->m_cbg[uVar17] + this->m_crg[uVar22] >> 0x10) + uVar33;
      iVar29 = uVar33 + this->m_cbb[uVar17];
      if (iVar28 < 1) {
        iVar28 = 0;
      }
      if (0xfe < iVar28) {
        iVar28 = 0xff;
      }
      if (iVar29 < 1) {
        iVar29 = 0;
      }
      *local_a0 = uVar15;
      if (0xfe < iVar29) {
        iVar29 = 0xff;
      }
      local_a0[1] = (uint8)iVar28;
      local_a0[2] = (uint8)iVar29;
      local_a0[3] = 0xff;
      uVar33 = (uint)H2V2ConvertFiltered::s_muls[0][uVar19][0];
      uVar23 = (uint)H2V2ConvertFiltered::s_muls[0][uVar19][1];
      uVar17 = (uint)H2V2ConvertFiltered::s_muls[0][uVar19][2];
      bVar9 = H2V2ConvertFiltered::s_muls[0][uVar19][3];
      uVar22 = uVar17 * bVar6 + uVar23 * uVar21 + uVar33 * bVar4 + (uint)bVar9 * (uint)bVar8 + 8 >>
               4;
      uVar19 = (uint)bVar9 * (uint)bVar7 + uVar17 * bVar5 + uVar23 * uVar12 + uVar33 * local_b0 + 8
               >> 4;
      iVar28 = this->m_crr[uVar22] + uVar20;
      if (iVar28 < 1) {
        iVar28 = 0;
      }
      if (0xfe < iVar28) {
        iVar28 = 0xff;
      }
      iVar29 = (this->m_cbg[uVar19] + this->m_crg[uVar22] >> 0x10) + uVar20;
      iVar24 = uVar20 + this->m_cbb[uVar19];
      if (iVar29 < 1) {
        iVar29 = 0;
      }
      uVar15 = (uint8)iVar29;
      if (0xfe < iVar29) {
        uVar15 = 0xff;
      }
      *local_b8 = (uint8)iVar28;
      if (iVar24 < 1) {
        iVar24 = 0;
      }
      local_b8[1] = uVar15;
      uVar15 = (uint8)iVar24;
      if (0xfe < iVar24) {
        uVar15 = 0xff;
      }
      local_b8[2] = uVar15;
      local_b8[3] = 0xff;
      iVar28 = this->m_image_x_size;
      if (((int)uVar16 < iVar28 + -1 & (byte)uVar18) == 1) {
        if (uVar13 != (int)uVar16 >> 1) {
          __assert_fail("c_x0 == (nx - 1) >> 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                        ,0x7ce,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
        }
        uVar16 = uVar16 + 1;
        uVar19 = uVar16 & 6 | (uVar16 >> 4) * 0x180 + (uVar16 & 8) * 8;
        iVar28 = check_sample_buf_ofs(this,uVar19 + uVar2);
        bVar9 = puVar32[iVar28];
        iVar28 = check_sample_buf_ofs(this,uVar19 + iVar25);
        uVar14 = (ulong)((uint)bVar6 + (uint)bVar6 * 8 + uVar21 + ((uint)bVar8 + (uint)bVar4) * 3 +
                         8 >> 2 & 0xffc);
        uVar18 = (ulong)((uint)bVar5 * 9 + uVar12 + ((uint)bVar3 + (uint)bVar7) * 3 + 8 >> 2 & 0xffc
                        );
        iVar29 = *(int *)((long)this->m_crr + uVar14) + (uint)bVar9;
        if (iVar29 < 1) {
          iVar29 = 0;
        }
        uVar15 = (uint8)iVar29;
        if (0xfe < iVar29) {
          uVar15 = 0xff;
        }
        iVar24 = (*(int *)((long)this->m_cbg + uVar18) + *(int *)((long)this->m_crg + uVar14) >>
                 0x10) + (uint)bVar9;
        iVar29 = (uint)bVar9 + *(int *)((long)this->m_cbb + uVar18);
        bVar9 = puVar32[iVar28];
        local_a0[4] = uVar15;
        if (iVar24 < 1) {
          iVar24 = 0;
        }
        uVar15 = (uint8)iVar24;
        if (0xfe < iVar24) {
          uVar15 = 0xff;
        }
        local_a0[5] = uVar15;
        if (iVar29 < 1) {
          iVar29 = 0;
        }
        uVar15 = (uint8)iVar29;
        if (0xfe < iVar29) {
          uVar15 = 0xff;
        }
        local_a0[6] = uVar15;
        local_b0 = (uint)bVar3;
        local_a8 = (uint)bVar4;
        local_a0[7] = 0xff;
        local_a0 = local_a0 + 8;
        uVar14 = (ulong)((uint)bVar8 * 9 + (bVar6 + uVar21) * 3 + local_a8 + 8 >> 2 & 0x7fc);
        uVar18 = (ulong)((bVar5 + uVar12) * 3 + local_b0 + (uint)bVar7 + (uint)bVar7 * 8 + 8 >> 2 &
                        0x7fc);
        iVar28 = *(int *)((long)this->m_crr + uVar14) + (uint)bVar9;
        if (iVar28 < 1) {
          iVar28 = 0;
        }
        if (0xfe < iVar28) {
          iVar28 = 0xff;
        }
        iVar29 = (*(int *)((long)this->m_cbg + uVar18) + *(int *)((long)this->m_crg + uVar14) >>
                 0x10) + (uint)bVar9;
        iVar24 = (uint)bVar9 + *(int *)((long)this->m_cbb + uVar18);
        if (iVar29 < 1) {
          iVar29 = 0;
        }
        uVar15 = (uint8)iVar29;
        if (0xfe < iVar29) {
          uVar15 = 0xff;
        }
        local_b8[4] = (uint8)iVar28;
        if (iVar24 < 1) {
          iVar24 = 0;
        }
        local_b8[5] = uVar15;
        uVar15 = (uint8)iVar24;
        if (0xfe < iVar24) {
          uVar15 = 0xff;
        }
        local_b8[6] = uVar15;
        local_b8[7] = 0xff;
        local_b8 = local_b8 + 8;
        iVar28 = this->m_image_x_size;
      }
      else {
        local_a0 = local_a0 + 4;
        local_b8 = local_b8 + 4;
      }
      uVar18 = (ulong)(uVar16 + 1);
    }
  }
  return local_94;
}

Assistant:

uint32_t jpeg_decoder::H2V2ConvertFiltered()
	{
		const uint BLOCKS_PER_MCU = 6;
		int y = m_image_y_size - m_total_lines_left;
		int row = y & 15;

		const int half_image_y_size = (m_image_y_size >> 1) - 1;

		uint8* d0 = m_pScan_line_0;

		int c_y0 = (y - 1) >> 1;
		int c_y1 = JPGD_MIN(c_y0 + 1, half_image_y_size);

		const uint8_t* p_YSamples = m_pSample_buf;
		const uint8_t* p_C0Samples = m_pSample_buf;
		if ((c_y0 >= 0) && (((row & 15) == 0) || ((row & 15) == 15)) && (m_total_lines_left > 1))
		{
			assert(y > 0);
			assert(m_sample_buf_prev_valid);

			if ((row & 15) == 15)
				p_YSamples = m_pSample_buf_prev;

			p_C0Samples = m_pSample_buf_prev;
		}

		const int y_sample_base_ofs = ((row & 8) ? 128 : 0) + (row & 7) * 8;
		const int y0_base = (c_y0 & 7) * 8 + 256;
		const int y1_base = (c_y1 & 7) * 8 + 256;

		const int half_image_x_size = (m_image_x_size >> 1) - 1;

		static const uint8_t s_muls[2][2][4] =
		{
			{ { 1, 3, 3, 9 }, { 3, 9, 1, 3 }, },
			{ { 3, 1, 9, 3 }, { 9, 3, 3, 1 } }
		};

		if (((row & 15) >= 1) && ((row & 15) <= 14))
		{
			assert((row & 1) == 1);
			assert(((y + 1 - 1) >> 1) == c_y0);

			assert(p_YSamples == m_pSample_buf);
			assert(p_C0Samples == m_pSample_buf);

			uint8* d1 = m_pScan_line_1;
			const int y_sample_base_ofs1 = (((row + 1) & 8) ? 128 : 0) + ((row + 1) & 7) * 8;

			for (int x = 0; x < m_image_x_size; x++)
			{
				int k = (x >> 4) * BLOCKS_PER_MCU * 64 + ((x & 8) ? 64 : 0) + (x & 7);
				int y_sample0 = p_YSamples[check_sample_buf_ofs(k + y_sample_base_ofs)];
				int y_sample1 = p_YSamples[check_sample_buf_ofs(k + y_sample_base_ofs1)];

				int c_x0 = (x - 1) >> 1;
				int c_x1 = JPGD_MIN(c_x0 + 1, half_image_x_size);
				c_x0 = JPGD_MAX(c_x0, 0);

				int a = (c_x0 >> 3) * BLOCKS_PER_MCU * 64 + (c_x0 & 7);
				int cb00_sample = p_C0Samples[check_sample_buf_ofs(a + y0_base)];
				int cr00_sample = p_C0Samples[check_sample_buf_ofs(a + y0_base + 64)];

				int cb01_sample = m_pSample_buf[check_sample_buf_ofs(a + y1_base)];
				int cr01_sample = m_pSample_buf[check_sample_buf_ofs(a + y1_base + 64)];

				int b = (c_x1 >> 3) * BLOCKS_PER_MCU * 64 + (c_x1 & 7);
				int cb10_sample = p_C0Samples[check_sample_buf_ofs(b + y0_base)];
				int cr10_sample = p_C0Samples[check_sample_buf_ofs(b + y0_base + 64)];

				int cb11_sample = m_pSample_buf[check_sample_buf_ofs(b + y1_base)];
				int cr11_sample = m_pSample_buf[check_sample_buf_ofs(b + y1_base + 64)];

				{
					const uint8_t* pMuls = &s_muls[row & 1][x & 1][0];
					int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
					int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

					int rc = m_crr[cr];
					int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
					int bc = m_cbb[cb];

					d0[0] = clamp(y_sample0 + rc);
					d0[1] = clamp(y_sample0 + gc);
					d0[2] = clamp(y_sample0 + bc);
					d0[3] = 255;

					d0 += 4;
				}

				{
					const uint8_t* pMuls = &s_muls[(row + 1) & 1][x & 1][0];
					int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
					int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

					int rc = m_crr[cr];
					int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
					int bc = m_cbb[cb];

					d1[0] = clamp(y_sample1 + rc);
					d1[1] = clamp(y_sample1 + gc);
					d1[2] = clamp(y_sample1 + bc);
					d1[3] = 255;

					d1 += 4;
				}

				if (((x & 1) == 1) && (x < m_image_x_size - 1))
				{
					const int nx = x + 1;
					assert(c_x0 == (nx - 1) >> 1);

					k = (nx >> 4) * BLOCKS_PER_MCU * 64 + ((nx & 8) ? 64 : 0) + (nx & 7);
					y_sample0 = p_YSamples[check_sample_buf_ofs(k + y_sample_base_ofs)];
					y_sample1 = p_YSamples[check_sample_buf_ofs(k + y_sample_base_ofs1)];

					{
						const uint8_t* pMuls = &s_muls[row & 1][nx & 1][0];
						int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
						int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

						int rc = m_crr[cr];
						int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
						int bc = m_cbb[cb];

						d0[0] = clamp(y_sample0 + rc);
						d0[1] = clamp(y_sample0 + gc);
						d0[2] = clamp(y_sample0 + bc);
						d0[3] = 255;

						d0 += 4;
					}

					{
						const uint8_t* pMuls = &s_muls[(row + 1) & 1][nx & 1][0];
						int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
						int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

						int rc = m_crr[cr];
						int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
						int bc = m_cbb[cb];

						d1[0] = clamp(y_sample1 + rc);
						d1[1] = clamp(y_sample1 + gc);
						d1[2] = clamp(y_sample1 + bc);
						d1[3] = 255;

						d1 += 4;
					}

					++x;
				}
			}

			return 2;
		}
		else
		{
			for (int x = 0; x < m_image_x_size; x++)
			{
				int y_sample = p_YSamples[check_sample_buf_ofs((x >> 4) * BLOCKS_PER_MCU * 64 + ((x & 8) ? 64 : 0) + (x & 7) + y_sample_base_ofs)];

				int c_x0 = (x - 1) >> 1;
				int c_x1 = JPGD_MIN(c_x0 + 1, half_image_x_size);
				c_x0 = JPGD_MAX(c_x0, 0);

				int a = (c_x0 >> 3) * BLOCKS_PER_MCU * 64 + (c_x0 & 7);
				int cb00_sample = p_C0Samples[check_sample_buf_ofs(a + y0_base)];
				int cr00_sample = p_C0Samples[check_sample_buf_ofs(a + y0_base + 64)];

				int cb01_sample = m_pSample_buf[check_sample_buf_ofs(a + y1_base)];
				int cr01_sample = m_pSample_buf[check_sample_buf_ofs(a + y1_base + 64)];

				int b = (c_x1 >> 3) * BLOCKS_PER_MCU * 64 + (c_x1 & 7);
				int cb10_sample = p_C0Samples[check_sample_buf_ofs(b + y0_base)];
				int cr10_sample = p_C0Samples[check_sample_buf_ofs(b + y0_base + 64)];

				int cb11_sample = m_pSample_buf[check_sample_buf_ofs(b + y1_base)];
				int cr11_sample = m_pSample_buf[check_sample_buf_ofs(b + y1_base + 64)];

				const uint8_t* pMuls = &s_muls[row & 1][x & 1][0];
				int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
				int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

				int rc = m_crr[cr];
				int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
				int bc = m_cbb[cb];

				d0[0] = clamp(y_sample + rc);
				d0[1] = clamp(y_sample + gc);
				d0[2] = clamp(y_sample + bc);
				d0[3] = 255;

				d0 += 4;
			}

			return 1;
		}
	}